

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Model *model,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t indent_00;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokset;
  stringstream ss;
  char local_214;
  undefined1 local_208 [32];
  _Base_ptr local_1e8;
  size_t local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  indent_00 = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)((ulong)model & 0xffffffff),n);
  poVar2 = ::std::operator<<(local_1a8,(string *)local_208);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0xa18),s);
  ::std::operator<<(poVar2,(string *)&local_1d8);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  if (*(long *)(this + 0xa00) != 0) {
    poVar2 = ::std::operator<<(local_1a8," ");
    ::std::operator<<(poVar2,(string *)(this + 0x9f8));
  }
  poVar2 = ::std::operator<<(local_1a8," \"");
  poVar2 = ::std::operator<<(poVar2,(string *)(this + 0x9d8));
  ::std::operator<<(poVar2,"\"\n");
  bVar1 = PrimMetas::authored((PrimMetas *)(this + 0xa28));
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)((ulong)model & 0xffffffff),n_00);
    poVar2 = ::std::operator<<(local_1a8,(string *)local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_
              ((string *)local_208,this + 0xa28,(PrimMeta *)(ulong)((int)model + 1),indent_00);
    ::std::operator<<(local_1a8,(string *)local_208);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)((ulong)model & 0xffffffff),n_01);
    poVar2 = ::std::operator<<(local_1a8,(string *)local_208);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)((ulong)model & 0xffffffff),n_02);
  poVar2 = ::std::operator<<(local_1a8,(string *)local_208);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::_M_dispose();
  local_208._24_8_ = local_208 + 8;
  local_208._8_4_ = _S_red;
  local_208._16_8_ = 0;
  local_1e0 = 0;
  local_1e8 = (_Base_ptr)local_208._24_8_;
  print_props(&local_1d8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0xe60),
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208,
              (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(this + 0xea8),
              (int)model + 1);
  ::std::operator<<(local_1a8,(string *)&local_1d8);
  ::std::__cxx11::string::_M_dispose();
  local_214 = (char)indent;
  if (local_214 != '\0') {
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)model & 0xffffffff),n_03);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_1d8);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::stringbuf::str();
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Model &model, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(model.spec);
  if (model.prim_type_name.size()) {
    ss << " " << model.prim_type_name;
  }
  ss << " \"" << model.name << "\"\n";

  if (model.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(model.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  std::set<std::string> tokset;
  ss << print_props(model.props, tokset, model.propertyNames(), indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}